

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O3

int pub0_sock_get_sendbuf(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  iVar1 = *(int *)((long)arg + 0x48);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  iVar1 = nni_copyout_int(iVar1,buf,szp,t);
  return iVar1;
}

Assistant:

static int
pub0_sock_get_sendbuf(void *arg, void *buf, size_t *szp, nni_type t)
{
	pub0_sock *sock = arg;
	int        val;
	nni_mtx_lock(&sock->mtx);
	val = (int) sock->sendbuf;
	nni_mtx_unlock(&sock->mtx);
	return (nni_copyout_int(val, buf, szp, t));
}